

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetRuleLauncher
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,
          string *prop,string *config)

{
  cmValue cVar1;
  string local_68;
  string local_48;
  
  cVar1 = cmMakefile::GetProperty(this->Makefile,prop);
  if (target != (cmGeneratorTarget *)0x0) {
    cVar1 = cmGeneratorTarget::GetProperty(target,prop);
  }
  if (cVar1.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_68);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)cVar1.Value);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (__return_storage_ptr__,&local_48,this,config,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetRuleLauncher(cmGeneratorTarget* target,
                                              const std::string& prop,
                                              const std::string& config)
{
  cmValue value = this->Makefile->GetProperty(prop);
  if (target) {
    value = target->GetProperty(prop);
  }
  if (value) {
    return cmGeneratorExpression::Evaluate(*value, this, config, target);
  }
  return "";
}